

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
dlib::trim<char,std::char_traits<char>,std::allocator<char>>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,dlib *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *trim_chars)

{
  long lVar1;
  
  lVar1 = std::__cxx11::string::find_first_not_of((string *)this,(ulong)str);
  if (lVar1 == -1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    std::__cxx11::string::find_last_not_of((string *)this,(ulong)str);
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)this);
  }
  return __return_storage_ptr__;
}

Assistant:

const std::basic_string<charT,traits,alloc> trim (
        const std::basic_string<charT,traits,alloc>& str,
        const std::basic_string<charT,traits,alloc>& trim_chars 
    )
    {
        typedef std::basic_string<charT,traits,alloc> string;
        typename string::size_type lpos = str.find_first_not_of(trim_chars); 
        if (lpos != string::npos)
        {
            typename string::size_type rpos = str.find_last_not_of(trim_chars);
            return str.substr(lpos,rpos-lpos+1);
        }
        else
        {
            return std::basic_string<charT,traits,alloc>();
        }
    }